

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

void __thiscall rw::AnimInterpolator::addTime(AnimInterpolator *this,float32 t)

{
  float32 *pfVar1;
  bool bVar2;
  InterpFrameHeader *pIVar3;
  InterpFrameHeader *local_30;
  InterpFrameHeader *ifrm;
  KeyFrameHeader *next;
  KeyFrameHeader *last;
  int32 i;
  float32 t_local;
  AnimInterpolator *this_local;
  
  if (0.0 < (float)t) {
    this->currentTime = (float32)((float)t + (float)this->currentTime);
    pfVar1 = &this->currentAnim->duration;
    if ((float)this->currentTime < (float)*pfVar1 || (float)this->currentTime == (float)*pfVar1) {
      pIVar3 = (InterpFrameHeader *)getAnimFrame(this,this->currentAnim->numFrames);
      ifrm = (InterpFrameHeader *)this->nextFrame;
      local_30 = (InterpFrameHeader *)0x0;
      while( true ) {
        bVar2 = false;
        if (ifrm < pIVar3) {
          bVar2 = (float)ifrm->keyFrame1->time <= (float)this->currentTime;
        }
        if (!bVar2) break;
        last._0_4_ = 0;
        while (((int)last < this->numNodes &&
               (local_30 = getInterpFrame(this,(int)last), local_30->keyFrame2 != ifrm->keyFrame1)))
        {
          last._0_4_ = (int)last + 1;
        }
        local_30->keyFrame1 = local_30->keyFrame2;
        local_30->keyFrame2 = (KeyFrameHeader *)ifrm;
        ifrm = (InterpFrameHeader *)((long)this->nextFrame + (long)this->currentAnimKeyFrameSize);
        this->nextFrame = ifrm;
      }
      for (last._0_4_ = 0; (int)last < this->numNodes; last._0_4_ = (int)last + 1) {
        pIVar3 = getInterpFrame(this,(int)last);
        (*this->interpCB)(pIVar3,pIVar3->keyFrame1,pIVar3->keyFrame2,this->currentTime,
                          this->currentAnim->customData);
      }
    }
    else {
      setCurrentAnim(this,this->currentAnim);
    }
  }
  return;
}

Assistant:

void
AnimInterpolator::addTime(float32 t)
{
	int32 i;
	if(t <= 0.0f)
		return;
	this->currentTime += t;
	// reset animation
	if(this->currentTime > this->currentAnim->duration){
		this->setCurrentAnim(this->currentAnim);
		return;
	}
	KeyFrameHeader *last = this->getAnimFrame(this->currentAnim->numFrames);
	KeyFrameHeader *next = (KeyFrameHeader*)this->nextFrame;
	InterpFrameHeader *ifrm = nil;
	while(next < last && next->prev->time <= this->currentTime){
		// find next interpolation frame to expire
		for(i = 0; i < this->numNodes; i++){
			ifrm = this->getInterpFrame(i);
			if(ifrm->keyFrame2 == next->prev)
				break;
		}
		// advance interpolation frame
		ifrm->keyFrame1 = ifrm->keyFrame2;
		ifrm->keyFrame2 = next;
		// ... and next frame
		next = (KeyFrameHeader*)((uint8*)this->nextFrame +
		                         currentAnimKeyFrameSize);
		this->nextFrame = next;
	}
	for(i = 0; i < this->numNodes; i++){
		ifrm = this->getInterpFrame(i);
		this->interpCB(ifrm, ifrm->keyFrame1, ifrm->keyFrame2,
		               this->currentTime,
		               this->currentAnim->customData);
	}
}